

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar5 = ctxt->valueNr;
    if ((long)iVar5 < 1) {
      iVar5 = 0x17;
    }
    else {
      uVar2 = iVar5 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar5 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ppxVar1[(long)iVar5 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar4 != (xmlXPathObjectPtr)0x0) {
        if (pxVar4->type != XPATH_STRING) {
          pxVar3 = xmlXPathCastToString(pxVar4);
          if (pxVar3 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
            xmlXPathReleaseObject(ctxt->context,pxVar4);
            pxVar3 = (xmlChar *)0x0;
          }
          else {
            xmlXPathReleaseObject(ctxt->context,pxVar4);
          }
          pxVar4 = xmlXPathCacheWrapString(ctxt,pxVar3);
        }
        goto LAB_001c2a33;
      }
      iVar5 = 10;
    }
  }
  else {
    if (nargs == 0) {
      pxVar3 = xmlNodeGetContent(ctxt->context->node);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
        pxVar3 = (xmlChar *)0x0;
      }
      pxVar4 = xmlXPathCacheWrapString(ctxt,pxVar3);
LAB_001c2a33:
      valuePush(ctxt,pxVar4);
      return;
    }
    iVar5 = 0xc;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    xmlChar *stringval;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        stringval = xmlXPathCastNodeToString(ctxt->context->node);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        valuePush(ctxt, xmlXPathCacheWrapString(ctxt, stringval));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_STRING) {
        stringval = xmlXPathCastToString(cur);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheWrapString(ctxt, stringval);
    }
    valuePush(ctxt, cur);
}